

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O3

void __thiscall MT32Emu::Display::rhythmNotePlayed(Display *this)

{
  Synth *this_00;
  bool bVar1;
  
  this->rhythmNotePlayedSinceLastReset = true;
  this_00 = this->synth;
  this->rhythmStateResetTimestamp = this_00->renderedSampleCount + 0xa00;
  this->midiMessagePlayedSinceLastReset = true;
  this->midiMessageLEDResetTimestamp = this_00->renderedSampleCount + 0xa00;
  bVar1 = Synth::isDisplayOldMT32Compatible(this_00);
  if ((bVar1) && (this->mode == Mode_CUSTOM_MESSAGE)) {
    this->displayResetScheduled = false;
    this->mode = Mode_MAIN;
    this->lcdDirty = true;
  }
  return;
}

Assistant:

void Display::rhythmNotePlayed() {
	rhythmNotePlayedSinceLastReset = true;
	rhythmStateResetTimestamp = synth.renderedSampleCount + BLINK_TIME_FRAMES;
	midiMessagePlayed();
	if (synth.isDisplayOldMT32Compatible() && mode == Mode_CUSTOM_MESSAGE) setMainDisplayMode();
}